

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_protocol_doing(connectdata *conn,_Bool *done)

{
  CURLcode local_1c;
  CURLcode result;
  _Bool *done_local;
  connectdata *conn_local;
  
  local_1c = CURLE_OK;
  if ((conn == (connectdata *)0x0) ||
     (conn->handler->doing == (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0)) {
    *done = true;
  }
  else {
    *done = false;
    local_1c = (*conn->handler->doing)(conn,done);
  }
  return local_1c;
}

Assistant:

CURLcode Curl_protocol_doing(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  if(conn && conn->handler->doing) {
    *done = FALSE;
    result = conn->handler->doing(conn, done);
  }
  else
    *done = TRUE;

  return result;
}